

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O3

void Imf_3_4::anon_unknown_0::interleave_sse2(char *source,size_t outSize,char *out)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  ulong uVar33;
  char *pcVar34;
  char *pcVar35;
  ulong uVar36;
  __m128i *v1;
  
  uVar33 = outSize + 1 >> 1;
  if (0x1f < outSize) {
    uVar36 = outSize >> 5;
    do {
      cVar1 = *source;
      cVar2 = source[1];
      cVar3 = source[2];
      cVar4 = source[3];
      cVar5 = source[4];
      cVar6 = source[5];
      cVar7 = source[6];
      cVar8 = source[7];
      cVar9 = source[8];
      cVar10 = source[9];
      cVar11 = source[10];
      cVar12 = source[0xb];
      cVar13 = source[0xc];
      cVar14 = source[0xd];
      cVar15 = source[0xe];
      cVar16 = source[0xf];
      pcVar34 = source + uVar33;
      cVar17 = *pcVar34;
      cVar18 = pcVar34[1];
      cVar19 = pcVar34[2];
      cVar20 = pcVar34[3];
      cVar21 = pcVar34[4];
      cVar22 = pcVar34[5];
      cVar23 = pcVar34[6];
      cVar24 = pcVar34[7];
      cVar25 = pcVar34[8];
      cVar26 = pcVar34[9];
      cVar27 = pcVar34[10];
      cVar28 = pcVar34[0xb];
      cVar29 = pcVar34[0xc];
      cVar30 = pcVar34[0xd];
      cVar31 = pcVar34[0xe];
      cVar32 = pcVar34[0xf];
      source = source + 0x10;
      *out = cVar1;
      out[1] = cVar17;
      out[2] = cVar2;
      out[3] = cVar18;
      out[4] = cVar3;
      out[5] = cVar19;
      out[6] = cVar4;
      out[7] = cVar20;
      out[8] = cVar5;
      out[9] = cVar21;
      out[10] = cVar6;
      out[0xb] = cVar22;
      out[0xc] = cVar7;
      out[0xd] = cVar23;
      out[0xe] = cVar8;
      out[0xf] = cVar24;
      out[0x10] = cVar9;
      out[0x11] = cVar25;
      out[0x12] = cVar10;
      out[0x13] = cVar26;
      out[0x14] = cVar11;
      out[0x15] = cVar27;
      out[0x16] = cVar12;
      out[0x17] = cVar28;
      out[0x18] = cVar13;
      out[0x19] = cVar29;
      out[0x1a] = cVar14;
      out[0x1b] = cVar30;
      out[0x1c] = cVar15;
      out[0x1d] = cVar31;
      out[0x1e] = cVar16;
      out[0x1f] = cVar32;
      out = out + 0x20;
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
  }
  uVar36 = outSize & 0xffffffffffffffe0;
  pcVar34 = source + uVar33;
  if (uVar36 != outSize) {
    do {
      uVar33 = (ulong)((uint)uVar36 & 1);
      pcVar35 = pcVar34;
      if (uVar33 == 0) {
        pcVar35 = source;
      }
      *out = *pcVar35;
      out = out + 1;
      uVar36 = uVar36 + 1;
      pcVar34 = pcVar34 + uVar33;
      source = source + (uVar33 ^ 1);
    } while (uVar36 < outSize);
  }
  return;
}

Assistant:

void
interleave_sse2 (const char* source, size_t outSize, char* out)
{
    static const size_t bytesPerChunk = 2 * sizeof (__m128i);

    const size_t vOutSize = outSize / bytesPerChunk;

    const __m128i* v1 = reinterpret_cast<const __m128i*> (source);
    const __m128i* v2 =
        reinterpret_cast<const __m128i*> (source + (outSize + 1) / 2);
    __m128i* vOut = reinterpret_cast<__m128i*> (out);

    for (size_t i = 0; i < vOutSize; ++i)
    {
        __m128i a = _mm_loadu_si128 (v1++);
        __m128i b = _mm_loadu_si128 (v2++);

        __m128i lo = _mm_unpacklo_epi8 (a, b);
        __m128i hi = _mm_unpackhi_epi8 (a, b);

        _mm_storeu_si128 (vOut++, lo);
        _mm_storeu_si128 (vOut++, hi);
    }

    const char* t1   = reinterpret_cast<const char*> (v1);
    const char* t2   = reinterpret_cast<const char*> (v2);
    char*       sOut = reinterpret_cast<char*> (vOut);

    for (size_t i = vOutSize * bytesPerChunk; i < outSize; ++i)
    {
        *(sOut++) = (i % 2 == 0) ? *(t1++) : *(t2++);
    }
}